

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O2

void checkerror(int rtperr)

{
  ostream *poVar1;
  int errcode;
  string sStack_38;
  
  if (-1 < rtperr) {
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"ERROR: ");
  jrtplib::RTPGetErrorString_abi_cxx11_(&sStack_38,(jrtplib *)(ulong)(uint)rtperr,errcode);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  exit(-1);
}

Assistant:

void checkerror(int rtperr)
{
	if (rtperr < 0)
	{
		std::cout << "ERROR: " << RTPGetErrorString(rtperr) << std::endl;
		exit(-1);
	}
}